

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O0

void verifyOrthonormal<float>(Matrix44<float> *A)

{
  Matrix44<float> *in_RDI;
  Matrix44<float> *pMVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  int j;
  int i;
  Matrix44<float> prod;
  float valueEps;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar2;
  int local_90;
  Matrix44<float> *in_stack_ffffffffffffff98;
  Matrix44<float> local_4c;
  float local_c;
  Matrix44<float> *local_8;
  
  local_8 = in_RDI;
  local_c = std::numeric_limits<float>::epsilon();
  local_c = local_c * 100.0;
  Imath_3_2::Matrix44<float>::transposed(in_stack_ffffffffffffff98);
  Imath_3_2::Matrix44<float>::operator*
            ((Matrix44<float> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             local_8);
  local_90 = 0;
  do {
    if (3 < local_90) {
      return;
    }
    for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
      if (local_90 == iVar2) {
        pMVar1 = &local_4c;
        Imath_3_2::Matrix44<float>::operator[](pMVar1,local_90);
        std::abs((int)pMVar1);
        if (1.1920929e-05 < extraout_XMM0_Da) {
          __assert_fail("std::abs (prod[i][j] - 1) <= valueEps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,0x30,"void verifyOrthonormal(const Imath_3_2::Matrix44<T> &) [T = float]");
        }
      }
      else {
        pMVar1 = &local_4c;
        Imath_3_2::Matrix44<float>::operator[](pMVar1,local_90);
        std::abs((int)pMVar1);
        if (1.1920929e-05 < extraout_XMM0_Da_00) {
          __assert_fail("std::abs (prod[i][j]) <= valueEps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,0x32,"void verifyOrthonormal(const Imath_3_2::Matrix44<T> &) [T = float]");
        }
      }
    }
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

void
verifyOrthonormal (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    const T valueEps = T (100) * std::numeric_limits<T>::epsilon ();

    const IMATH_INTERNAL_NAMESPACE::Matrix44<T> prod = A * A.transposed ();
    for (int i = 0; i < 4; ++i)
    {
        for (int j = 0; j < 4; ++j)
        {
            if (i == j)
                assert (std::abs (prod[i][j] - 1) <= valueEps);
            else
                assert (std::abs (prod[i][j]) <= valueEps);
        }
    }
}